

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O0

int readImmediate(InternalInstruction *insn,uint8_t size)

{
  int iVar1;
  uint64_t local_28;
  uint64_t imm64;
  uint32_t imm32;
  uint16_t imm16;
  uint8_t imm8;
  uint8_t size_local;
  InternalInstruction *insn_local;
  
  if (insn->numImmediatesConsumed == '\x02') {
    insn_local._4_4_ = -1;
  }
  else {
    if (size == '\0') {
      imm64._7_1_ = insn->immediateSize;
    }
    else {
      insn->immediateSize = size;
      imm64._7_1_ = size;
    }
    insn->immediateOffset = (char)(int)insn->readerCursor - (char)(int)insn->startLocation;
    _imm32 = insn;
    switch(imm64._7_1_) {
    case '\x01':
      iVar1 = consumeByte(insn,(uint8_t *)((long)&imm64 + 6));
      if (iVar1 != 0) {
        return -1;
      }
      _imm32->immediates[_imm32->numImmediatesConsumed] = (ulong)imm64._6_1_;
      break;
    case '\x02':
      iVar1 = consumeUInt16(insn,(uint16_t *)((long)&imm64 + 4));
      if (iVar1 != 0) {
        return -1;
      }
      _imm32->immediates[_imm32->numImmediatesConsumed] = (ulong)imm64._4_2_;
      break;
    case '\x04':
      iVar1 = consumeUInt32(insn,(uint32_t *)&imm64);
      if (iVar1 != 0) {
        return -1;
      }
      _imm32->immediates[_imm32->numImmediatesConsumed] = (ulong)(uint)imm64;
      break;
    case '\b':
      iVar1 = consumeUInt64(insn,&local_28);
      if (iVar1 != 0) {
        return -1;
      }
      _imm32->immediates[_imm32->numImmediatesConsumed] = local_28;
    }
    _imm32->numImmediatesConsumed = _imm32->numImmediatesConsumed + '\x01';
    insn_local._4_4_ = 0;
  }
  return insn_local._4_4_;
}

Assistant:

static int readImmediate(struct InternalInstruction *insn, uint8_t size)
{
	uint8_t imm8;
	uint16_t imm16;
	uint32_t imm32;
	uint64_t imm64;

	// dbgprintf(insn, "readImmediate()");

	if (insn->numImmediatesConsumed == 2) {
		//debug("Already consumed two immediates");
		return -1;
	}

	if (size == 0)
		size = insn->immediateSize;
	else
		insn->immediateSize = size;
	insn->immediateOffset = (uint8_t)(insn->readerCursor - insn->startLocation);

	switch (size) {
		case 1:
			if (consumeByte(insn, &imm8))
				return -1;
			insn->immediates[insn->numImmediatesConsumed] = imm8;
			break;
		case 2:
			if (consumeUInt16(insn, &imm16))
				return -1;
			insn->immediates[insn->numImmediatesConsumed] = imm16;
			break;
		case 4:
			if (consumeUInt32(insn, &imm32))
				return -1;
			insn->immediates[insn->numImmediatesConsumed] = imm32;
			break;
		case 8:
			if (consumeUInt64(insn, &imm64))
				return -1;
			insn->immediates[insn->numImmediatesConsumed] = imm64;
			break;
	}

	insn->numImmediatesConsumed++;

	return 0;
}